

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::BackgroundPageQueue::PushFreePageEntry(BackgroundPageQueue *this,FreePageEntry *entry)

{
  AutoCriticalSection local_28;
  AutoCriticalSection autoCS;
  
  local_28.cs = &this->backgroundPageQueueCriticalSection;
  CCLock::Enter(&(local_28.cs)->super_CCLock);
  entry->Next = this->bgFreePageList;
  this->bgFreePageList = entry;
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void PushFreePageEntry(FreePageEntry* entry)
        {
#if SUPPORT_WIN32_SLIST
            ::InterlockedPushEntrySList(&bgFreePageList, entry);
#else
            AutoCriticalSection autoCS(&backgroundPageQueueCriticalSection);
            entry->Next = bgFreePageList;
            bgFreePageList = entry;
#endif
        }